

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void __thiscall
duckdb::DataTable::InitializeLocalStorage
          (DataTable *this,LocalAppendState *state,TableCatalogEntry *table,ClientContext *context,
          vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
          *bound_constraints)

{
  pointer __p;
  LocalStorage *this_00;
  pointer __p_00;
  TransactionException *this_01;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  
  if ((this->version)._M_i == MAIN_TABLE) {
    this_00 = LocalStorage::Get(context,this->db);
    LocalStorage::InitializeStorage(this_00,state,this);
    __p_00 = (pointer)operator_new(0x10);
    __p_00->table = table;
    __p_00->bound_constraints = bound_constraints;
    local_88._M_dataplus._M_p = (pointer)0x0;
    ::std::__uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>::
    reset((__uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_> *
          )&state->constraint_state,__p_00);
    ::std::unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>::
    ~unique_ptr((unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
                 *)&local_88);
    return;
  }
  this_01 = (TransactionException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_88,
             "Transaction conflict: attempting to insert into table \"%s\" but it has been %s by a different transaction"
             ,&local_89);
  GetTableName_abi_cxx11_(&local_48,this);
  TableModification_abi_cxx11_(&local_68,this);
  TransactionException::TransactionException<std::__cxx11::string,std::__cxx11::string>
            (this_01,&local_88,&local_48,&local_68);
  __cxa_throw(this_01,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DataTable::InitializeLocalStorage(LocalAppendState &state, TableCatalogEntry &table, ClientContext &context,
                                       const vector<unique_ptr<BoundConstraint>> &bound_constraints) {
	if (!IsMainTable()) {
		throw TransactionException("Transaction conflict: attempting to insert into table \"%s\" but it has been %s by "
		                           "a different transaction",
		                           GetTableName(), TableModification());
	}

	auto &local_storage = LocalStorage::Get(context, db);
	local_storage.InitializeStorage(state, *this);
	state.constraint_state = InitializeConstraintState(table, bound_constraints);
}